

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

string * __thiscall cppcms::http::context::skin_abi_cxx11_(context *this)

{
  _data *p_Var1;
  long in_RSI;
  string *in_RDI;
  
  p_Var1 = booster::hold_ptr<cppcms::http::context::_data>::operator->
                     ((hold_ptr<cppcms::http::context::_data> *)(in_RSI + 0x10));
  std::__cxx11::string::string((string *)in_RDI,(string *)&p_Var1->skin);
  return in_RDI;
}

Assistant:

std::string context::skin()
{
	return d->skin;
}